

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O1

int __thiscall HttpResponse::buildFirstLine(HttpResponse *this)

{
  string *psVar1;
  int iVar2;
  long lVar3;
  char statusCodeBuf [17];
  char local_28 [16];
  undefined1 local_18;
  
  local_18 = 0;
  iVar2 = snprintf(local_28,0x10,"%d",(ulong)(uint)this->mResponseCode);
  if (0xf < iVar2) {
    jh_log_print(1,"virtual int HttpResponse::buildFirstLine() const",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpResponse.cpp"
                 ,0x103,"mResponseCode %d exceeds kStatusCodeSize %d",
                 (ulong)(uint)this->mResponseCode,0x10);
  }
  psVar1 = &(this->super_HttpHeader).super_HttpHeaderBase.mHeaderStr;
  std::__cxx11::string::_M_replace
            ((ulong)psVar1,0,
             (char *)(this->super_HttpHeader).super_HttpHeaderBase.mHeaderStr._M_string_length,
             0x1254b4);
  std::__cxx11::string::append((char *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
  lVar3 = 8;
  do {
    if (*(int *)(lVar3 + 0x131c78) == this->mResponseCode) break;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x278);
  std::__cxx11::string::append((char *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
  return (int)(this->super_HttpHeader).super_HttpHeaderBase.mHeaderStr._M_string_length;
}

Assistant:

int HttpResponse::buildFirstLine() const
{
	char statusCodeBuf[kStatusCodeSize + 1];
	statusCodeBuf[kStatusCodeSize] = '\0'; // terminate in case of error

	int res = snprintf(statusCodeBuf, kStatusCodeSize, "%d", mResponseCode);
	
	if (res >= kStatusCodeSize)
	{
		LOG_ERR_FATAL("mResponseCode %d exceeds kStatusCodeSize %d",
					  mResponseCode, kStatusCodeSize);
	}

	mHeaderStr = "HTTP/1.1 ";
	mHeaderStr += statusCodeBuf;
	mHeaderStr += " ";
	mHeaderStr += getResponseString(mResponseCode);
	mHeaderStr += "\r\n";
	
	return mHeaderStr.size();
}